

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# failure_test.cxx
# Opt level: O3

ReturnCode
failure_test::ool_detect_cb(atomic<bool> *invoked,size_t purge_upto,Type type,Param *params)

{
  _func_int **pp_Var1;
  ostream *poVar2;
  _func_int *p_Var3;
  pthread_t local_48;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  if (type == OutOfLogRangeWarning) {
    if (purge_upto + 1 == *params->ctx) {
      LOCK();
      (invoked->_M_base)._M_i = true;
      UNLOCK();
    }
    else {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      poVar2 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"        time: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[1;30m",7);
      TestSuite::getTimeString_abi_cxx11_();
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_40,local_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"      thread: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[33m",5);
      pp_Var1 = poVar2->_vptr_basic_ostream;
      *(uint *)(&poVar2->field_0x18 + (long)pp_Var1[-3]) =
           *(uint *)(&poVar2->field_0x18 + (long)pp_Var1[-3]) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar2->field_0x10 + (long)pp_Var1[-3]) = 4;
      p_Var3 = (_func_int *)((long)&poVar2->_vptr_basic_ostream + (long)pp_Var1[-3]);
      if ((&poVar2->field_0xe1)[(long)pp_Var1[-3]] == '\0') {
        std::ios::widen((char)p_Var3);
        p_Var3[0xe1] = (code)0x1;
      }
      p_Var3[0xe0] = (code)0x30;
      local_48 = pthread_self();
      std::_Hash_bytes(&local_48,8,0xc70f6907);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"          in: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[36m",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"operator()",10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"()\x1b[0m",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"          at: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[32m",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/failure_test.cxx"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[0m:",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[1;35m",7);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x106);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"    value of: \x1b[1;34mool_args->startIdxOfLeader\x1b[0m\n",0x34);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    expected: \x1b[1;32m",0x15);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[0m\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"      actual: \x1b[1;31m",0x15);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[0m\n",5);
      if (local_40 != local_30) {
        operator_delete(local_40);
      }
      TestSuite::failHandler();
    }
  }
  else {
    cb_default(type,params);
  }
  return Ok;
}

Assistant:

cb_func::ReturnCode ool_detect_cb(std::atomic<bool>* invoked,
                                  size_t purge_upto,
                                  cb_func::Type type,
                                  cb_func::Param* params)
{
    if (type == cb_func::Type::OutOfLogRangeWarning) {
        cb_func::OutOfLogRangeWarningArgs* ool_args =
            (cb_func::OutOfLogRangeWarningArgs*)params->ctx;
        auto chk_func = [purge_upto, ool_args]() -> int {
            CHK_EQ(purge_upto + 1, ool_args->startIdxOfLeader);
            return 0;
        };
        if (chk_func() == 0) {
            invoked->store(true);
        }
    } else {
        return cb_default(type, params);
    }

    return cb_func::ReturnCode::Ok;
}